

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadStream.cpp
# Opt level: O3

ssize_t __thiscall ReadStream::read(ReadStream *this,int __fd,void *__buf,size_t __nbytes)

{
  iterator iVar1;
  char cVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  long *plVar7;
  char ch;
  uchar local_2b;
  uchar local_2a;
  uchar local_29;
  
  plVar7 = (long *)CONCAT44(in_register_00000034,__fd);
  uVar6 = __nbytes & 0xffffffff;
  iVar5 = (int)__nbytes;
  *(undefined8 *)this = 0;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    std::istream::seekg(plVar7,(long)(int)__buf,0);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 2) == 0) {
      iVar4 = 0;
      if (0 < iVar5) {
        iVar4 = iVar5;
      }
      if (*(int *)((long)plVar7 + 0x20c) < iVar5) {
        iVar4 = 0;
      }
      iVar4 = *(int *)((long)plVar7 + 0x20c) - iVar4;
      *(int *)((long)plVar7 + 0x20c) = iVar4;
      if (iVar5 <= iVar4) {
        while( true ) {
          plVar3 = (long *)std::istream::get((char *)plVar7);
          iVar5 = (int)uVar6;
          if (((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) ||
             (iVar5 < 1)) break;
          iVar1._M_current = *(uchar **)&this->field_0x8;
          if (iVar1._M_current == *(uchar **)&this->field_0x10) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,iVar1,&local_29
                      );
          }
          else {
            *iVar1._M_current = local_2b;
            *(long *)&this->field_0x8 = *(long *)&this->field_0x8 + 1;
          }
          uVar6 = (ulong)(iVar5 - 1);
        }
        if ((0 < *(int *)((long)plVar7 + 0x20c)) &&
           (*(long *)&this->field_0x8 == *(long *)this && 0 < iVar5)) {
          iVar5 = iVar5 + 1;
          do {
            iVar1._M_current = *(uchar **)&this->field_0x8;
            if (iVar1._M_current == *(uchar **)&this->field_0x10) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              _M_realloc_insert<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,iVar1,
                         &local_2a);
            }
            else {
              *iVar1._M_current = local_2b;
              *(long *)&this->field_0x8 = *(long *)&this->field_0x8 + 1;
            }
            iVar5 = iVar5 + -1;
          } while (1 < iVar5);
        }
      }
    }
  }
  return (ssize_t)this;
}

Assistant:

vector<unsigned char> ReadStream::read(int position, int count) {
        vector<unsigned char> ivector;

        if(!f.is_open())
            return ivector;

        f.seekg(position);
        if(f.eof())
            return ivector;

        size = (count > size || count < 0) ? size : size - count;
        if(count <= size) {
            char ch;
            while (f.get(ch) && count > 0) {
                ivector.push_back(ch);
                --count;
            }
            if(size > 0 && ivector.size() == 0) {
                while (count > 0) {
                    ivector.push_back(ch);
                    --count;
                }
            }
        }
        return ivector;
    }